

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphbn(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  tcolumn *colptr;
  char card [81];
  char *cptr;
  char extnm [71];
  char comm [73];
  char name [75];
  char tfmt [30];
  LONGLONG naxis1;
  long width;
  long repeat;
  int iread;
  int datatype;
  int ii;
  char *in_stack_fffffffffffffe20;
  char local_1d8 [8];
  undefined1 local_1d0;
  int *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe80;
  char in_stack_fffffffffffffe88;
  char cVar4;
  undefined7 in_stack_fffffffffffffe89;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  fitsfile *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffeb8;
  int *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  fitsfile *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  fitsfile *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef8;
  long *in_stack_ffffffffffffff00;
  long *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char local_88 [40];
  long local_60;
  long local_58;
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  long local_30;
  long local_28;
  int local_1c;
  long local_18;
  int *local_10;
  int local_4;
  
  local_44 = 0;
  if (*(int *)card._8_8_ < 1) {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
             (int *)CONCAT71(in_stack_fffffffffffffe89,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80);
    }
    if (*(long *)(*(long *)(local_10 + 2) + 0x70) ==
        *(long *)(*(long *)(*(long *)(local_10 + 2) + 0x68) +
                 (long)*(int *)(*(long *)(local_10 + 2) + 0x54) * 8)) {
      if (local_18 < 0) {
        *(undefined4 *)card._8_8_ = 0xda;
        local_4 = 0xda;
      }
      else if ((long)card._0_8_ < 0) {
        *(undefined4 *)card._8_8_ = 0xd6;
        local_4 = 0xd6;
      }
      else if ((local_1c < 0) || (999 < local_1c)) {
        *(undefined4 *)card._8_8_ = 0xd8;
        local_4 = 0xd8;
      }
      else {
        cVar4 = '\0';
        if (colptr != (tcolumn *)0x0) {
          strncat(&stack0xfffffffffffffe88,colptr->ttype,0x46);
        }
        ffpkys(in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8
              );
        ffpkyj(in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (LONGLONG)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
        ffpkyj(in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (LONGLONG)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
        local_60 = 0;
        for (local_3c = 0; local_3c < local_1c; local_3c = local_3c + 1) {
          ffbnfm(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          if (local_40 == 0x10) {
            local_60 = local_50 + local_60;
          }
          else if (local_40 == 1) {
            local_60 = (local_50 + 7) / 8 + local_60;
          }
          else if (local_40 < 1) {
            if ((((**(char **)(local_30 + (long)local_3c * 8) == 'P') ||
                 (*(char *)(*(long *)(local_30 + (long)local_3c * 8) + 1) == 'P')) ||
                (**(char **)(local_30 + (long)local_3c * 8) == 'p')) ||
               (*(char *)(*(long *)(local_30 + (long)local_3c * 8) + 1) == 'p')) {
              local_60 = local_60 + 8;
            }
            else {
              local_60 = local_60 + 0x10;
            }
          }
          else {
            local_60 = local_50 * (local_40 / 10) + local_60;
          }
          if (0 < *(int *)card._8_8_) break;
        }
        ffpkyj(in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (LONGLONG)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
        ffpkyj(in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (LONGLONG)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
        ffpkyj(in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (LONGLONG)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
        ffpkyj(in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (LONGLONG)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
        ffpkyj(in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (LONGLONG)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
        for (local_3c = 0; local_3c < local_1c; local_3c = local_3c + 1) {
          if (**(char **)(local_28 + (long)local_3c * 8) != '\0') {
            snprintf(&stack0xfffffffffffffed8,0x49,"label for field %3d",(ulong)(local_3c + 1));
            ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                   in_stack_fffffffffffffe40);
            ffpkys(in_stack_fffffffffffffed8,
                   (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8);
          }
          sVar2 = strlen(*(char **)(local_30 + (long)local_3c * 8));
          if (0x1d < sVar2) {
            ffpmsg((char *)0x24fbfa);
            *(undefined4 *)card._8_8_ = 0x105;
            break;
          }
          strcpy(local_88,*(char **)(local_30 + (long)local_3c * 8));
          ffupch(in_stack_fffffffffffffe20);
          ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe40);
          strcpy(&stack0xfffffffffffffed8,"data format of field");
          ffbnfm(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          if (local_40 == 0x10) {
            strcat(&stack0xfffffffffffffed8,": ASCII Character");
            pcVar3 = strchr(local_88,0x41);
            if (pcVar3 + 1 != (char *)0x0) {
              local_44 = __isoc99_sscanf(pcVar3 + 1,"%ld",&local_58);
            }
            if ((local_44 == 1) && (local_50 < local_58)) {
              if (local_50 == 1) {
                strcpy(&stack0xfffffffffffffed8,"ERROR??  USING ASCII TABLE SYNTAX BY MISTAKE??");
              }
              else {
                strcpy(&stack0xfffffffffffffed8,"rAw FORMAT ERROR! UNIT WIDTH w > COLUMN WIDTH r");
              }
            }
          }
          else if (local_40 == 1) {
            strcat(&stack0xfffffffffffffed8,": BIT");
          }
          else if (local_40 == 0xb) {
            strcat(&stack0xfffffffffffffed8,": BYTE");
          }
          else if (local_40 == 0xe) {
            strcat(&stack0xfffffffffffffed8,": 1-byte LOGICAL");
          }
          else if (local_40 == 0x15) {
            strcat(&stack0xfffffffffffffed8,": 2-byte INTEGER");
          }
          else if (local_40 == 0x14) {
            strcat(&stack0xfffffffffffffed8,": 2-byte INTEGER");
          }
          else if (local_40 == 0x29) {
            strcat(&stack0xfffffffffffffed8,": 4-byte INTEGER");
          }
          else if (local_40 == 0x51) {
            strcat(&stack0xfffffffffffffed8,": 8-byte INTEGER");
          }
          else if (local_40 == 0x28) {
            strcat(&stack0xfffffffffffffed8,": 4-byte INTEGER");
          }
          else if (local_40 == 0x50) {
            strcat(&stack0xfffffffffffffed8,": 8-byte INTEGER");
          }
          else if (local_40 == 0x2a) {
            strcat(&stack0xfffffffffffffed8,": 4-byte REAL");
          }
          else if (local_40 == 0x52) {
            strcat(&stack0xfffffffffffffed8,": 8-byte DOUBLE");
          }
          else if (local_40 == 0x53) {
            strcat(&stack0xfffffffffffffed8,": COMPLEX");
          }
          else if (local_40 == 0xa3) {
            strcat(&stack0xfffffffffffffed8,": DOUBLE COMPLEX");
          }
          else if (local_40 < 0) {
            strcat(&stack0xfffffffffffffed8,": variable length array");
          }
          iVar1 = local_40;
          if (local_40 < 1) {
            iVar1 = -local_40;
          }
          if (iVar1 == 0xc) {
            for (pcVar3 = local_88; *pcVar3 != 'S'; pcVar3 = pcVar3 + 1) {
            }
            *pcVar3 = 'B';
            ffpkys(in_stack_fffffffffffffed8,
                   (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8);
            ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                   in_stack_fffffffffffffe40);
            strcpy(&stack0xfffffffffffffed8,"offset for signed bytes");
            ffpkyg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   (double)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                   in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
            ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                   in_stack_fffffffffffffe40);
            strcpy(&stack0xfffffffffffffed8,"data are not scaled");
            ffpkyg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   (double)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                   in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          }
          else {
            iVar1 = local_40;
            if (local_40 < 1) {
              iVar1 = -local_40;
            }
            if (iVar1 == 0x14) {
              for (pcVar3 = local_88; *pcVar3 != 'U'; pcVar3 = pcVar3 + 1) {
              }
              *pcVar3 = 'I';
              ffpkys(in_stack_fffffffffffffed8,
                     (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8);
              ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                     in_stack_fffffffffffffe40);
              strcpy(&stack0xfffffffffffffed8,"offset for unsigned integers");
              ffpkyg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     (double)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                     in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
              ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                     in_stack_fffffffffffffe40);
              strcpy(&stack0xfffffffffffffed8,"data are not scaled");
              ffpkyg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     (double)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                     in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
            }
            else {
              iVar1 = local_40;
              if (local_40 < 1) {
                iVar1 = -local_40;
              }
              if (iVar1 == 0x28) {
                for (pcVar3 = local_88; *pcVar3 != 'V'; pcVar3 = pcVar3 + 1) {
                }
                *pcVar3 = 'J';
                ffpkys(in_stack_fffffffffffffed8,
                       (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                       in_stack_fffffffffffffeb8);
                ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48
                       ,in_stack_fffffffffffffe40);
                strcpy(&stack0xfffffffffffffed8,"offset for unsigned integers");
                ffpkyg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                       (double)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                       in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
                ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48
                       ,in_stack_fffffffffffffe40);
                strcpy(&stack0xfffffffffffffed8,"data are not scaled");
                ffpkyg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                       (double)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                       in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
              }
              else {
                iVar1 = local_40;
                if (local_40 < 1) {
                  iVar1 = -local_40;
                }
                if (iVar1 == 0x50) {
                  for (pcVar3 = local_88; *pcVar3 != 'W'; pcVar3 = pcVar3 + 1) {
                  }
                  *pcVar3 = 'K';
                  ffpkys(in_stack_fffffffffffffed8,
                         (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
                  ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                         in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
                  strcat(local_1d8,"     ");
                  local_1d0 = 0;
                  strcat(local_1d8,"=  9223372036854775808 / offset for unsigned integers");
                  ffprec(in_stack_fffffffffffffe98,
                         (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         (int *)CONCAT71(in_stack_fffffffffffffe89,cVar4));
                  ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                         in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
                  strcpy(&stack0xfffffffffffffed8,"data are not scaled");
                  ffpkyg(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                         (double)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                         in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
                }
                else {
                  ffpkys(in_stack_fffffffffffffed8,
                         (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
                }
              }
            }
          }
          if (((local_38 != 0) && (*(long *)(local_38 + (long)local_3c * 8) != 0)) &&
             (**(char **)(local_38 + (long)local_3c * 8) != '\0')) {
            ffkeyn(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                   in_stack_fffffffffffffe40);
            ffpkys(in_stack_fffffffffffffed8,
                   (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8);
          }
          if (0 < *(int *)card._8_8_) break;
        }
        if (cVar4 != '\0') {
          ffpkys(in_stack_fffffffffffffed8,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
        }
        if (0 < *(int *)card._8_8_) {
          ffpmsg((char *)0x2505d6);
        }
        local_4 = *(int *)card._8_8_;
      }
    }
    else {
      *(undefined4 *)card._8_8_ = 0xc9;
      local_4 = 0xc9;
    }
  }
  else {
    local_4 = *(int *)card._8_8_;
  }
  return local_4;
}

Assistant:

int ffphbn(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount,     /* I - size of the variable length heap area    */
           int *status)     /* IO - error status                            */
/*
  Put required Header keywords into the Binary Table:
*/
{
    int ii, datatype, iread = 0;
    long repeat, width;
    LONGLONG naxis1;

    char tfmt[30], name[FLEN_KEYWORD], comm[FLEN_COMMENT], extnm[FLEN_VALUE];
    char *cptr, card[FLEN_CARD];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (pcount < 0)
        return(*status = BAD_PCOUNT);
    else if (tfields < 0 || tfields > 999)
        return(*status = BAD_TFIELDS);

    extnm[0] = '\0';
    if (extnmx)
        strncat(extnm, extnmx, FLEN_VALUE-1);

    ffpkys(fptr, "XTENSION", "BINTABLE", "binary table extension", status);
    ffpkyj(fptr, "BITPIX", 8, "8-bit bytes", status);
    ffpkyj(fptr, "NAXIS", 2, "2-dimensional binary table", status);

    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)  /* sum the width of each field */
    {
        ffbnfm(tform[ii], &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
            naxis1 += repeat;   /* one byte per char */
        else if (datatype == TBIT)
            naxis1 += (repeat + 7) / 8;
        else if (datatype > 0)
            naxis1 += repeat * (datatype / 10);
        else if (tform[ii][0] == 'P' || tform[ii][1] == 'P'||
                 tform[ii][0] == 'p' || tform[ii][1] == 'p')
           /* this is a 'P' variable length descriptor (neg. datatype) */
            naxis1 += 8;
        else
           /* this is a 'Q' variable length descriptor (neg. datatype) */
            naxis1 += 16;

        if (*status > 0)
            break;       /* abort loop on error */
    }

    ffpkyj(fptr, "NAXIS1", naxis1, "width of table in bytes", status);
    ffpkyj(fptr, "NAXIS2", naxis2, "number of rows in table", status);

    /*
      the initial value of PCOUNT (= size of the variable length array heap)
      should always be zero.  If any variable length data is written, then
      the value of PCOUNT will be updated when the HDU is closed
    */
    ffpkyj(fptr, "PCOUNT", 0, "size of special data area", status);
    ffpkyj(fptr, "GCOUNT", 1, "one data group (required keyword)", status);
    ffpkyj(fptr, "TFIELDS", tfields, "number of fields in each row", status);

    for (ii = 0; ii < tfields; ii++) /* loop over every column */
    {
        if ( *(ttype[ii]) )  /* optional TTYPEn keyword */
        {
          snprintf(comm, FLEN_COMMENT,"label for field %3d", ii + 1);
          ffkeyn("TTYPE", ii + 1, name, status);
          ffpkys(fptr, name, ttype[ii], comm, status);
        }

        if (strlen(tform[ii]) > 29)
        {
          ffpmsg("Error: BIN table TFORM code is too long (ffphbn)");
          *status = BAD_TFORM;
          break;
        }
        strcpy(tfmt, tform[ii]);  /* required TFORMn keyword */
        ffupch(tfmt);

        ffkeyn("TFORM", ii + 1, name, status);
        strcpy(comm, "data format of field");

        ffbnfm(tfmt, &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
        {
            strcat(comm, ": ASCII Character");

            /* Do sanity check to see if an ASCII table format was used,  */
            /* e.g., 'A8' instead of '8A', or a bad unit width eg '8A9'.  */
            /* Don't want to return an error status, so write error into  */
            /* the keyword comment.  */

            cptr = strchr(tfmt,'A');
            cptr++;

            if (cptr)
               iread = sscanf(cptr,"%ld", &width);

            if (iread == 1 && (width > repeat)) 
            {
              if (repeat == 1)
                strcpy(comm, "ERROR??  USING ASCII TABLE SYNTAX BY MISTAKE??");
              else
                strcpy(comm, "rAw FORMAT ERROR! UNIT WIDTH w > COLUMN WIDTH r");
            }
        }
        else if (datatype == TBIT)
           strcat(comm, ": BIT");
        else if (datatype == TBYTE)
           strcat(comm, ": BYTE");
        else if (datatype == TLOGICAL)
           strcat(comm, ": 1-byte LOGICAL");
        else if (datatype == TSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TUSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TLONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TLONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TULONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TULONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TFLOAT)
           strcat(comm, ": 4-byte REAL");
        else if (datatype == TDOUBLE)
           strcat(comm, ": 8-byte DOUBLE");
        else if (datatype == TCOMPLEX)
           strcat(comm, ": COMPLEX");
        else if (datatype == TDBLCOMPLEX)
           strcat(comm, ": DOUBLE COMPLEX");
        else if (datatype < 0)
           strcat(comm, ": variable length array");

        if (abs(datatype) == TSBYTE) /* signed bytes */
        {
           /* Replace the 'S' with an 'B' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'S') 
              cptr++;

           *cptr = 'B';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for signed bytes");

           ffpkyg(fptr, name, -128., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TUSHORT) 
        {
           /* Replace the 'U' with an 'I' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'U') 
              cptr++;

           *cptr = 'I';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 32768., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONG) 
        {
           /* Replace the 'V' with an 'J' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'V') 
              cptr++;

           *cptr = 'J';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 2147483648., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONGLONG) 
        {	   
           /* Replace the 'W' with an 'K' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'W') 
              cptr++;

           *cptr = 'K';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, card, status);
           strcat(card, "     ");  /* make sure name is >= 8 chars long */
           *(card+8) = '\0';
	   strcat(card, "=  9223372036854775808 / offset for unsigned integers");
	   fits_write_record(fptr, card, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else
        {
           ffpkys(fptr, name, tfmt, comm, status);
        }

        if (tunit)
        {
         if (tunit[ii] && *(tunit[ii]) ) /* optional TUNITn keyword */
         {
          ffkeyn("TUNIT", ii + 1, name, status);
          ffpkys(fptr, name, tunit[ii],
             "physical unit of field", status);
         }
        }

        if (*status > 0)
            break;       /* abort loop on error */
    }

    if (extnm[0])       /* optional EXTNAME keyword */
        ffpkys(fptr, "EXTNAME", extnm,
               "name of this binary table extension", status);

    if (*status > 0)
        ffpmsg("Failed to write binary table header keywords (ffphbn)");

    return(*status);
}